

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

string * __thiscall
muduo::detail::FixedBuffer<4000000>::toString_abi_cxx11_(FixedBuffer<4000000> *this)

{
  int iVar1;
  FixedBuffer<4000000> *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  iVar1 = length(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,in_RSI->data_,(long)iVar1,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

string toString() const { return string(data_, length()); }